

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::iterate
          (GeometryShaderRenderTest *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *pRVar4;
  int *piVar5;
  NotSupportedError *this_00;
  undefined4 extraout_var;
  ShaderProgram *program;
  string local_100;
  string local_e0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  int local_20;
  int height;
  int width;
  int iteration;
  GeometryShaderRenderTest *this_local;
  
  height = this->m_interationCount;
  this->m_interationCount = height + 1;
  _width = this;
  if (height != 0) {
    if (height == 1) {
      iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
      renderWithContext(this,this->m_glContext,(ShaderProgram *)CONCAT44(extraout_var,iVar3),
                        this->m_glResult);
      renderWithContext(this,&this->m_refContext->super_Context,
                        (ShaderProgram *)CONCAT44(extraout_var,iVar3),this->m_refResult);
      this_local._4_4_ = CONTINUE;
    }
    else {
      bVar2 = compare(this);
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image comparison failed");
      }
      this_local._4_4_ = STOP;
    }
    return this_local._4_4_;
  }
  pRVar4 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  local_20 = tcu::RenderTarget::getWidth(pRVar4);
  pRVar4 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  local_24 = tcu::RenderTarget::getHeight(pRVar4);
  iVar1 = local_20;
  piVar5 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  iVar3 = local_24;
  if ((*piVar5 <= iVar1) &&
     (piVar5 = tcu::Vector<int,_2>::y(&this->m_viewportSize), *piVar5 <= iVar3)) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
    return CONTINUE;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Render target size must be at least ",&local_a9);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  de::toString<int>(&local_e0,piVar5);
  std::operator+(&local_88,&local_a8,&local_e0);
  std::operator+(&local_68,&local_88,"x");
  piVar5 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
  de::toString<int>(&local_100,piVar5);
  std::operator+(&local_48,&local_68,&local_100);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderRenderTest::iterate (void)
{
	// init() must be called
	DE_ASSERT(m_glContext);
	DE_ASSERT(m_refContext);

	const int iteration = m_interationCount++;

	if (iteration == 0)
	{
		// Check requirements
		const int width	 = m_context.getRenderTarget().getWidth();
		const int height = m_context.getRenderTarget().getHeight();

		if (width < m_viewportSize.x() || height < m_viewportSize.y())
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_viewportSize.x()) + "x" + de::toString(m_viewportSize.y()));

		// Gen data
		genVertexAttribData();

		return CONTINUE;
	}
	else if (iteration == 1)
	{
		// Render
		sglr::ShaderProgram& program = getProgram();

		renderWithContext(*m_glContext, program, *m_glResult);
		renderWithContext(*m_refContext, program, *m_refResult);

		return CONTINUE;
	}
	else
	{
		if (compare())
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

		return STOP;
	}
}